

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int StoreImageToBitMask(VP8LBitWriter *bw,int width,int histo_bits,VP8LBackwardRefs *refs,
                       uint32_t *histogram_symbols,HuffmanTreeCode *huffman_codes,WebPPicture *pic)

{
  PixOrCopy *p;
  uint32_t code_index;
  int iVar1;
  uint32_t uVar2;
  VP8LBackwardRefs *in_RCX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  long in_RDI;
  uint *in_R8;
  long in_R9;
  WebPPicture *in_stack_00000008;
  int distance;
  int code_2;
  int n_bits;
  int bits;
  int literal_ix;
  int code_1;
  int code;
  int k;
  PixOrCopy *v;
  VP8LRefsCursor c;
  HuffmanTreeCode *codes;
  int histogram_ix;
  int tile_y;
  int tile_x;
  int y;
  int x;
  int tile_mask;
  int histo_xsize;
  int in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  uint bits_00;
  uint32_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int local_7c;
  VP8LRefsCursor local_70;
  long local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint32_t local_34;
  long local_30;
  uint *local_28;
  VP8LBackwardRefs *local_20;
  uint32_t local_18;
  uint32_t local_14;
  long local_10;
  int local_4;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  if (in_EDX == 0) {
    code_index = 1;
  }
  else {
    code_index = VP8LSubSampleSize(in_ESI,in_EDX);
  }
  if (local_18 == 0) {
    bits_00 = 0;
  }
  else {
    bits_00 = -(1 << ((byte)local_18 & 0x1f));
  }
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  local_4c = *local_28 >> 8 & 0xffff;
  local_58 = local_30 + (long)(int)(local_4c * 5) * 0x18;
  local_38 = bits_00;
  local_34 = code_index;
  VP8LRefsCursorInit(&local_70,local_20);
  while (iVar1 = VP8LRefsCursorOk(&local_70), p = local_70.cur_pos, iVar1 != 0) {
    if ((local_44 != (local_3c & local_38)) || (local_48 != (local_40 & local_38))) {
      local_44 = local_3c & local_38;
      local_48 = local_40 & local_38;
      in_stack_ffffffffffffff5c = ((int)local_40 >> ((byte)local_18 & 0x1f)) * local_34;
      local_4c = local_28[(int)(in_stack_ffffffffffffff5c +
                               ((int)local_3c >> ((byte)local_18 & 0x1f)))] >> 8 & 0xffff;
      local_58 = local_30 + (long)(int)(local_4c * 5) * 0x18;
    }
    iVar1 = PixOrCopyIsLiteral(local_70.cur_pos);
    if (iVar1 == 0) {
      iVar1 = PixOrCopyIsCacheIdx(p);
      if (iVar1 == 0) {
        in_stack_ffffffffffffff68 = PixOrCopyDistance(p);
        VP8LPrefixEncode(in_stack_ffffffffffffff74,
                         (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (int *)CONCAT44(code_index,bits_00),
                         (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        WriteHuffmanCodeWithExtraBits
                  ((VP8LBitWriter *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (HuffmanTreeCode *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   code_index,bits_00,in_stack_ffffffffffffff5c);
        VP8LPrefixEncode(in_stack_ffffffffffffff74,
                         (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (int *)CONCAT44(code_index,bits_00),
                         (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        WriteHuffmanCode((VP8LBitWriter *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (HuffmanTreeCode *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),code_index);
        VP8LPutBits((VP8LBitWriter *)CONCAT44(code_index,bits_00),in_stack_ffffffffffffff5c,
                    in_stack_ffffffffffffff58);
      }
      else {
        PixOrCopyCacheIdx(p);
        WriteHuffmanCode((VP8LBitWriter *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (HuffmanTreeCode *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),code_index);
      }
    }
    else {
      for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
        PixOrCopyLiteral(p,(uint)"\x01\x02"[local_7c]);
        WriteHuffmanCode((VP8LBitWriter *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (HuffmanTreeCode *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),code_index);
      }
    }
    uVar2 = PixOrCopyLength(p);
    for (local_3c = uVar2 + local_3c; (int)local_14 <= (int)local_3c; local_3c = local_3c - local_14
        ) {
      local_40 = local_40 + 1;
    }
    VP8LRefsCursorNext((VP8LRefsCursor *)0x1b2e23);
  }
  if (*(int *)(local_10 + 0x28) == 0) {
    local_4 = 1;
  }
  else {
    local_4 = WebPEncodingSetError(in_stack_00000008,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return local_4;
}

Assistant:

static int StoreImageToBitMask(VP8LBitWriter* const bw, int width,
                               int histo_bits,
                               const VP8LBackwardRefs* const refs,
                               const uint32_t* histogram_symbols,
                               const HuffmanTreeCode* const huffman_codes,
                               const WebPPicture* const pic) {
  const int histo_xsize = histo_bits ? VP8LSubSampleSize(width, histo_bits) : 1;
  const int tile_mask = (histo_bits == 0) ? 0 : -(1 << histo_bits);
  // x and y trace the position in the image.
  int x = 0;
  int y = 0;
  int tile_x = x & tile_mask;
  int tile_y = y & tile_mask;
  int histogram_ix = (histogram_symbols[0] >> 8) & 0xffff;
  const HuffmanTreeCode* codes = huffman_codes + 5 * histogram_ix;
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    const PixOrCopy* const v = c.cur_pos;
    if ((tile_x != (x & tile_mask)) || (tile_y != (y & tile_mask))) {
      tile_x = x & tile_mask;
      tile_y = y & tile_mask;
      histogram_ix = (histogram_symbols[(y >> histo_bits) * histo_xsize +
                                        (x >> histo_bits)] >>
                      8) &
                     0xffff;
      codes = huffman_codes + 5 * histogram_ix;
    }
    if (PixOrCopyIsLiteral(v)) {
      static const uint8_t order[] = { 1, 2, 0, 3 };
      int k;
      for (k = 0; k < 4; ++k) {
        const int code = PixOrCopyLiteral(v, order[k]);
        WriteHuffmanCode(bw, codes + k, code);
      }
    } else if (PixOrCopyIsCacheIdx(v)) {
      const int code = PixOrCopyCacheIdx(v);
      const int literal_ix = 256 + NUM_LENGTH_CODES + code;
      WriteHuffmanCode(bw, codes, literal_ix);
    } else {
      int bits, n_bits;
      int code;

      const int distance = PixOrCopyDistance(v);
      VP8LPrefixEncode(v->len, &code, &n_bits, &bits);
      WriteHuffmanCodeWithExtraBits(bw, codes, 256 + code, bits, n_bits);

      // Don't write the distance with the extra bits code since
      // the distance can be up to 18 bits of extra bits, and the prefix
      // 15 bits, totaling to 33, and our PutBits only supports up to 32 bits.
      VP8LPrefixEncode(distance, &code, &n_bits, &bits);
      WriteHuffmanCode(bw, codes + 4, code);
      VP8LPutBits(bw, bits, n_bits);
    }
    x += PixOrCopyLength(v);
    while (x >= width) {
      x -= width;
      ++y;
    }
    VP8LRefsCursorNext(&c);
  }
  if (bw->error_) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return 1;
}